

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O0

int Ssw_ManSweepResimulateDyn(Ssw_Man_t *p,int f)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  bool local_29;
  abctime clk;
  int RetValue2;
  int RetValue1;
  int f_local;
  Ssw_Man_t *p_local;
  
  aVar3 = Abc_Clock();
  Ssw_ManSweepTransferDyn(p);
  Ssw_SmlSimulateOne(p->pSml);
  iVar1 = Ssw_ClassesRefineConst1(p->ppClasses,1);
  iVar2 = Ssw_ClassesRefine(p->ppClasses,1);
  Vec_PtrCleanSimInfo(p->vSimInfo,0,1);
  p->nPatterns = 0;
  p->nSimRounds = p->nSimRounds + 1;
  aVar4 = Abc_Clock();
  p->timeSimSat = (aVar4 - aVar3) + p->timeSimSat;
  local_29 = 0 < iVar1 || 0 < iVar2;
  return (int)local_29;
}

Assistant:

int Ssw_ManSweepResimulateDyn( Ssw_Man_t * p, int f )
{
    int RetValue1, RetValue2;
    abctime clk = Abc_Clock();
    // transfer PI simulation information from storage
//    Ssw_SmlAssignDist1Plus( p->pSml, p->pPatWords );
    Ssw_ManSweepTransferDyn( p );
    // simulate internal nodes
//    Ssw_SmlSimulateOneFrame( p->pSml );
    Ssw_SmlSimulateOne( p->pSml );
    // check equivalence classes
    RetValue1 = Ssw_ClassesRefineConst1( p->ppClasses, 1 );
    RetValue2 = Ssw_ClassesRefine( p->ppClasses, 1 );
    // prepare simulation info for the next round
    Vec_PtrCleanSimInfo( p->vSimInfo, 0, 1 );
    p->nPatterns = 0;
    p->nSimRounds++;
p->timeSimSat += Abc_Clock() - clk;
    return RetValue1 > 0 || RetValue2 > 0;
}